

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O3

void __thiscall
helics::CoreApp::CoreApp(CoreApp *this,CoreType ctype,string_view coreName,int argc,char **argv)

{
  ParseOutput PVar1;
  _Head_base<0UL,_helics::helicsCLI11App_*,_false> local_40;
  int local_34;
  _Alloc_hider local_30;
  
  (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  local_34 = argc;
  local_30._M_p = (pointer)argv;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->name,coreName._M_str,coreName._M_str + coreName._M_len);
  generateParser((CoreApp *)&local_40);
  (local_40._M_head_impl)->coreType = ctype;
  PVar1 = helicsCLI11App::helics_parse<int&,char**&>
                    (local_40._M_head_impl,&local_34,(char ***)&local_30);
  if (PVar1 == OK) {
    processArgs(this,(unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                      *)&local_40);
  }
  if (local_40._M_head_impl != (helicsCLI11App *)0x0) {
    (*((local_40._M_head_impl)->super_App)._vptr_App[1])();
  }
  return;
}

Assistant:

CoreApp::CoreApp(CoreType ctype, std::string_view coreName, int argc, char* argv[]): name(coreName)
{
    auto app = generateParser();
    app->setDefaultCoreType(ctype);
    if (app->helics_parse(argc, argv) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}